

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

void spdlog::details::os::_thread_name(char *name,size_t length)

{
  spdlog_ex *psVar1;
  int *piVar2;
  allocator local_79;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  int local_1c;
  size_t sStack_18;
  int retval;
  size_t length_local;
  char *name_local;
  
  sStack_18 = length;
  length_local = (size_t)name;
  if (length < 0x10) {
    psVar1 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"Error! Insufficient buffer length.",&local_79)
    ;
    spdlog_ex::spdlog_ex(psVar1,&local_78);
    __cxa_throw(psVar1,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  local_1c = 0;
  local_1c = prctl(0x10,name);
  if (local_1c == -1) {
    local_55 = 1;
    psVar1 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Warning! Thread name get failed.",&local_41);
    piVar2 = __errno_location();
    spdlog_ex::spdlog_ex(psVar1,&local_40,*piVar2);
    local_55 = 0;
    __cxa_throw(psVar1,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  return;
}

Assistant:

inline void _thread_name(char * name, size_t length)
{    
#ifdef _WIN32
    HANDLE threadHandle = ::OpenThread(THREAD_QUERY_INFORMATION, false, static_cast<DWORD>(thread_id()));
    if (threadHandle)
    {
	wchar_t* data;
	HRESULT hr = ::GetThreadDescription(threadHandle, &data);
	if (SUCCEEDED(hr))
	{ 
	    std::wcstombs(name, data, length);
	    ::LocalFree(data);
	}
    }

    ::CloseHandle(threadHandle);
#else
    static const size_t    THREAD_NAME_LENGTH = 16;  // Length is restricted by the OS. Includes null-termination.
    
    if (THREAD_NAME_LENGTH <= length)
    {
        int retval = 0;
        
        retval = prctl(PR_GET_NAME, name);
        if (-1 == retval)
        {
	    throw spdlog_ex("Warning! Thread name get failed.", errno);
        }
    }
    else
    {
        throw spdlog_ex("Error! Insufficient buffer length.");
    }
#endif
}